

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionDAGChecker.cxx
# Opt level: O0

string * __thiscall
cmGeneratorExpressionDAGChecker::TopTarget_abi_cxx11_
          (string *__return_storage_ptr__,cmGeneratorExpressionDAGChecker *this)

{
  cmGeneratorExpressionDAGChecker *local_28;
  cmGeneratorExpressionDAGChecker *parent;
  cmGeneratorExpressionDAGChecker *top;
  cmGeneratorExpressionDAGChecker *this_local;
  
  parent = this;
  for (local_28 = this->Parent; local_28 != (cmGeneratorExpressionDAGChecker *)0x0;
      local_28 = local_28->Parent) {
    parent = local_28;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&parent->Target);
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorExpressionDAGChecker::TopTarget() const
{
  const cmGeneratorExpressionDAGChecker *top = this;
  const cmGeneratorExpressionDAGChecker *parent = this->Parent;
  while (parent)
    {
    top = parent;
    parent = parent->Parent;
    }
  return top->Target;
}